

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void alGetSource3i(ALuint name,ALenum param,ALint *value1,ALint *value2,ALint *value3)

{
  anon_union_4_2_32316eff cvt_1;
  uint32 x;
  uint32 uVar1;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetSource3i);
  writele32(name);
  writele32(param);
  IO_UINT64((uint64)value1);
  IO_UINT64((uint64)value2);
  IO_UINT64((uint64)value3);
  (*REAL_alGetSource3i)(name,param,value1,value2,value3);
  x = 0;
  uVar1 = 0;
  if (value1 != (ALint *)0x0) {
    uVar1 = *value1;
  }
  writele32(uVar1);
  if (value2 != (ALint *)0x0) {
    x = *value2;
  }
  writele32(x);
  if (value3 == (ALint *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *value3;
  }
  writele32(uVar1);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetSource3i(ALuint name, ALenum param, ALint *value1, ALint *value2, ALint *value3)
{
    IO_START(alGetSource3i);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_PTR(value1);
    IO_PTR(value2);
    IO_PTR(value3);
    REAL_alGetSource3i(name, param, value1, value2, value3);
    IO_INT32(value1 ? *value1 : 0);
    IO_INT32(value2 ? *value2 : 0);
    IO_INT32(value3 ? *value3 : 0);
    IO_END();
}